

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void verify_db(storage_t *st)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  checkpoint_t *info_00;
  long in_RDI;
  char rbuf [256];
  fdb_kvs_info info;
  int exp_suma;
  int db_suma;
  int db_nidx;
  int exp_nidx;
  int exp_ndocs;
  int db_ndocs;
  checkpoint_t *db_checkpoint;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  char local_1a8 [55];
  undefined1 in_stack_fffffffffffffe8f;
  fdb_file_handle *in_stack_fffffffffffffe90;
  tx_type_t in_stack_ffffffffffffff1e;
  storage_t *in_stack_ffffffffffffff20;
  fdb_kvs_handle *in_stack_ffffffffffffffa8;
  timeval local_18;
  long local_8;
  
  local_8 = in_RDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  info_00 = create_checkpoint(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1e);
  uVar1 = info_00->ndocs;
  uVar2 = *(uint *)(*(long *)(local_8 + 0x38) + 0x400);
  uVar3 = *(undefined4 *)(*(long *)(local_8 + 0x38) + 0x404);
  uVar4 = info_00->num_indexed;
  iVar5 = info_00->sum_age_indexed;
  uVar6 = *(undefined4 *)(*(long *)(local_8 + 0x38) + 0x408);
  e2e_fdb_commit(in_stack_fffffffffffffe90,(bool)in_stack_fffffffffffffe8f);
  fdb_get_kvs_info(in_stack_ffffffffffffffa8,(fdb_kvs_info *)info_00);
  free(info_00);
  sprintf(local_1a8,"[%s] verifydb: ndocs(%d=%d), nidx(%d=%d), sumage(%d=%d)\n",local_8 + 0x48,
          (ulong)uVar1,(ulong)uVar2,(ulong)uVar4,uVar3,iVar5,uVar6);
  return;
}

Assistant:

void verify_db(storage_t *st) {

    TEST_INIT();

    checkpoint_t *db_checkpoint = create_checkpoint(st, END_CHECKPOINT);
    int db_ndocs = db_checkpoint->ndocs;
    int exp_ndocs = st->v_chk->ndocs;
    int exp_nidx = st->v_chk->num_indexed;
    int db_nidx = db_checkpoint->num_indexed;
    int db_suma = db_checkpoint->sum_age_indexed;
    int exp_suma = st->v_chk->sum_age_indexed;
    fdb_kvs_info info;
    char rbuf[256];

    e2e_fdb_commit(st->main, st->walflush);

    fdb_get_kvs_info(st->index1, &info);

#ifdef __DEBUG_E2E
    int val1, val2;
    fdb_iterator *it;
    fdb_doc *rdoc = NULL;
    if (db_ndocs != exp_ndocs) {
        // for debugging: currently inaccurate for concurrency patterns
        fdb_get_kvs_info(st->all_docs, &info);
        val1 = info.doc_count;
        (void)val1;
        val2 = 0;
        fdb_iterator_init(st->index1, &it, NULL, 0,
                          NULL, 0, FDB_ITR_NONE);
        do {
            fdb_iterator_get(it, &rdoc);
            if (!rdoc->deleted) {
                val2++;
            }
            fdb_doc_free(rdoc);
            rdoc=NULL;
        } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
        printf("ndocs_debug: kvs_info(%d) == exp_ndocs(%d) ?\n", val1,exp_ndocs);
        printf("ndocs_debug: kvs_info(%d) == itr_count(%d) ?\n", val1, val2);
        fdb_iterator_close(it);
    }
    printf("[%s] db_ndix(%d) == exp_nidx(%d)\n", st->keyspace, db_nidx, exp_nidx);
#endif

    free(db_checkpoint);
    db_checkpoint=NULL;
    //TEST_CHK(db_nidx==exp_nidx);
    //TEST_CHK(db_suma==exp_suma);

    sprintf(rbuf, "[%s] verifydb: ndocs(%d=%d), nidx(%d=%d), sumage(%d=%d)\n",
            st->keyspace,
            db_ndocs, exp_ndocs,
            db_nidx, exp_nidx,
            db_suma, exp_suma);
#ifdef __DEBUG_E2E
    TEST_RESULT(rbuf);
#endif
}